

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O3

int tcp_get_nodelay(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  int *piVar2;
  socklen_t local_28;
  int local_24;
  socklen_t valsz;
  int val;
  
  iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
  local_24 = 0;
  local_28 = 4;
  iVar1 = getsockopt(iVar1,6,1,&local_24,&local_28);
  if (iVar1 == 0) {
    iVar1 = nni_copyout_bool(local_24 != 0,buf,szp,t);
  }
  else {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
  }
  return iVar1;
}

Assistant:

static int
tcp_get_nodelay(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_tcp_conn *c     = arg;
	int           fd    = nni_posix_pfd_fd(&c->pfd);
	int           val   = 0;
	socklen_t     valsz = sizeof(val);

	if (getsockopt(fd, IPPROTO_TCP, TCP_NODELAY, &val, &valsz) != 0) {
		return (nni_plat_errno(errno));
	}

	return (nni_copyout_bool(val, buf, szp, t));
}